

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_Vocoder_synthesize
               (HTS_Vocoder *v,size_t m,double lf0,double *spectrum,size_t nlpf,double *lpf,
               double alpha,double beta,double volume,double *rawdata,HTS_Audio *audio)

{
  size_t sVar1;
  double *in_RDX;
  ulong in_RSI;
  HTS_Vocoder *in_RDI;
  HTS_Vocoder *in_R8;
  HTS_Vocoder *in_R9;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double *in_XMM1_Qa;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  HTS_Vocoder *in_XMM2_Qa;
  double *in_XMM3_Qa;
  double p;
  int rawidx;
  short xs;
  int j;
  int i;
  double x;
  double *in_stack_ffffffffffffff88;
  double dVar6;
  int iVar7;
  undefined2 in_stack_ffffffffffffff9c;
  short in_stack_ffffffffffffff9e;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar8;
  int in_stack_ffffffffffffffa4;
  int iVar9;
  double *in_stack_ffffffffffffffa8;
  
  iVar7 = 0;
  if ((in_XMM0_Qa != -10000000000.0) || (NAN(in_XMM0_Qa))) {
    if (2.995732273553991 < in_XMM0_Qa) {
      if (in_XMM0_Qa < 9.903487552536127) {
        in_stack_ffffffffffffff88 = (double *)in_RDI->rate;
        dVar6 = exp(in_XMM0_Qa);
        dVar6 = (double)in_stack_ffffffffffffff88 / dVar6;
      }
      else {
        dVar6 = in_RDI->rate / 20000.0;
      }
    }
    else {
      dVar6 = in_RDI->rate / 20.0;
    }
  }
  else {
    dVar6 = 0.0;
  }
  if (in_RDI->is_first == '\x01') {
    HTS_Vocoder_initialize_excitation
              ((HTS_Vocoder *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (double)CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7))
               ,(size_t)dVar6);
    if (in_RDI->stage == 0) {
      HTS_mc2b((double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (double *)
               CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7)),
               (int)((ulong)dVar6 >> 0x20),(double)in_stack_ffffffffffffff88);
    }
    else {
      HTS_movem(in_RDX,in_RDI->c,(int)in_RSI + 1);
      HTS_lsp2mgc(in_R9,in_stack_ffffffffffffffa8,
                  (double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c),dVar6);
      HTS_mc2b((double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (double *)
               CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7)),
               (int)((ulong)dVar6 >> 0x20),(double)in_stack_ffffffffffffff88);
      HTS_gnorm((double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                (double *)
                CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7)),
                (int)((ulong)dVar6 >> 0x20),(double)in_stack_ffffffffffffff88);
      for (in_stack_ffffffffffffffa4 = 1; (ulong)(long)in_stack_ffffffffffffffa4 <= in_RSI;
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
        in_RDI->c[in_stack_ffffffffffffffa4] = in_RDI->gamma * in_RDI->c[in_stack_ffffffffffffffa4];
      }
    }
    in_RDI->is_first = '\0';
  }
  HTS_Vocoder_start_excitation(in_RDI,dVar6);
  if (in_RDI->stage == 0) {
    HTS_Vocoder_postfilter_mcp
              (in_XMM2_Qa,in_XMM3_Qa,(int)((ulong)in_R9 >> 0x20),(double)in_stack_ffffffffffffffa8,
               (double)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    HTS_mc2b((double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (double *)CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7))
             ,(int)((ulong)dVar6 >> 0x20),(double)in_stack_ffffffffffffff88);
    for (iVar9 = 0; (ulong)(long)iVar9 <= in_RSI; iVar9 = iVar9 + 1) {
      sVar1 = in_RDI->fprd;
      auVar4._8_4_ = (int)(sVar1 >> 0x20);
      auVar4._0_8_ = sVar1;
      auVar4._12_4_ = 0x45300000;
      in_RDI->cinc[iVar9] =
           (in_RDI->cc[iVar9] - in_RDI->c[iVar9]) /
           ((auVar4._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    }
  }
  else {
    HTS_Vocoder_postfilter_lsp(in_R8,in_XMM1_Qa,(size_t)in_XMM2_Qa,(double)in_XMM3_Qa,(double)in_R9)
    ;
    HTS_check_lsp_stability(in_RDX,in_RSI);
    HTS_lsp2mgc(in_R9,in_stack_ffffffffffffffa8,
                (double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                CONCAT22(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff9c),dVar6);
    HTS_mc2b((double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (double *)CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7))
             ,(int)((ulong)dVar6 >> 0x20),(double)in_stack_ffffffffffffff88);
    HTS_gnorm((double *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
              (double *)
              CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7)),
              (int)((ulong)dVar6 >> 0x20),(double)in_stack_ffffffffffffff88);
    for (iVar9 = 1; (ulong)(long)iVar9 <= in_RSI; iVar9 = iVar9 + 1) {
      in_RDI->cc[iVar9] = in_RDI->gamma * in_RDI->cc[iVar9];
    }
    for (iVar9 = 0; (ulong)(long)iVar9 <= in_RSI; iVar9 = iVar9 + 1) {
      sVar1 = in_RDI->fprd;
      auVar5._8_4_ = (int)(sVar1 >> 0x20);
      auVar5._0_8_ = sVar1;
      auVar5._12_4_ = 0x45300000;
      in_RDI->cinc[iVar9] =
           (in_RDI->cc[iVar9] - in_RDI->c[iVar9]) /
           ((auVar5._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
    }
  }
  for (iVar8 = 0; (ulong)(long)iVar8 < in_RDI->fprd; iVar8 = iVar8 + 1) {
    dVar2 = HTS_Vocoder_get_excitation
                      ((HTS_Vocoder *)CONCAT44(iVar9,iVar8),
                       (double *)
                       CONCAT26(in_stack_ffffffffffffff9e,CONCAT24(in_stack_ffffffffffffff9c,iVar7))
                      );
    if (in_RDI->stage == 0) {
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        dVar3 = exp(*in_RDI->c);
        dVar2 = dVar3 * dVar2;
      }
      dVar2 = HTS_mlsadf((double)in_XMM2_Qa,in_XMM3_Qa,(int)((ulong)in_R9 >> 0x20),dVar2,iVar9,
                         (double *)
                         CONCAT26(in_stack_ffffffffffffff9e,
                                  CONCAT24(in_stack_ffffffffffffff9c,iVar7)));
    }
    else {
      dVar2 = HTS_mglsadf((double)in_R9,(double *)(*in_RDI->c * dVar2),iVar9,
                          (double)CONCAT26(in_stack_ffffffffffffff9e,
                                           CONCAT24(in_stack_ffffffffffffff9c,iVar7)),
                          (int)((ulong)dVar6 >> 0x20),in_stack_ffffffffffffff88);
    }
    dVar2 = (double)in_XMM3_Qa * dVar2;
    if (in_R9 != (HTS_Vocoder *)0x0) {
      *(double *)(&in_R9->is_first + (long)iVar7 * 8) = dVar2;
      iVar7 = iVar7 + 1;
    }
    if (p != 0.0) {
      if (dVar2 <= 32767.0) {
        if (-32768.0 <= dVar2) {
          in_stack_ffffffffffffff9e = (short)(int)dVar2;
        }
        else {
          in_stack_ffffffffffffff9e = -0x8000;
        }
      }
      else {
        in_stack_ffffffffffffff9e = 0x7fff;
      }
      HTS_Audio_write((HTS_Audio *)p,in_stack_ffffffffffffff9e);
    }
    for (iVar9 = 0; (ulong)(long)iVar9 <= in_RSI; iVar9 = iVar9 + 1) {
      in_RDI->c[iVar9] = in_RDI->cinc[iVar9] + in_RDI->c[iVar9];
    }
  }
  HTS_Vocoder_end_excitation(in_RDI,dVar6);
  HTS_movem(in_RDI->cc,in_RDI->c,(int)in_RSI + 1);
  return;
}

Assistant:

void HTS_Vocoder_synthesize(HTS_Vocoder * v, size_t m, double lf0, double *spectrum, size_t nlpf, double *lpf, double alpha, double beta, double volume, double *rawdata, HTS_Audio * audio)
{
   double x;
   int i, j;
   short xs;
   int rawidx = 0;
   double p;

   /* lf0 -> pitch */
   if (lf0 == LZERO)
      p = 0.0;
   else if (lf0 <= MIN_LF0)
      p = v->rate / MIN_F0;
   else if (lf0 >= MAX_LF0)
      p = v->rate / MAX_F0;
   else
      p = v->rate / exp(lf0);

   /* first time */
   if (v->is_first == TRUE) {
      HTS_Vocoder_initialize_excitation(v, p, nlpf);
      if (v->stage == 0) {      /* for MCP */
         HTS_mc2b(spectrum, v->c, m, alpha);
      } else {                  /* for LSP */
         HTS_movem(spectrum, v->c, m + 1);
         HTS_lsp2mgc(v, v->c, v->c, m, alpha);
         HTS_mc2b(v->c, v->c, m, alpha);
         HTS_gnorm(v->c, v->c, m, v->gamma);
         for (i = 1; i <= m; i++)
            v->c[i] *= v->gamma;
      }
      v->is_first = FALSE;
   }

   HTS_Vocoder_start_excitation(v, p);
   if (v->stage == 0) {         /* for MCP */
      HTS_Vocoder_postfilter_mcp(v, spectrum, m, alpha, beta);
      HTS_mc2b(spectrum, v->cc, m, alpha);
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   } else {                     /* for LSP */
      HTS_Vocoder_postfilter_lsp(v, spectrum, m, alpha, beta);
      HTS_check_lsp_stability(spectrum, m);
      HTS_lsp2mgc(v, spectrum, v->cc, m, alpha);
      HTS_mc2b(v->cc, v->cc, m, alpha);
      HTS_gnorm(v->cc, v->cc, m, v->gamma);
      for (i = 1; i <= m; i++)
         v->cc[i] *= v->gamma;
      for (i = 0; i <= m; i++)
         v->cinc[i] = (v->cc[i] - v->c[i]) / v->fprd;
   }

   for (j = 0; j < v->fprd; j++) {
      x = HTS_Vocoder_get_excitation(v, lpf);
      if (v->stage == 0) {      /* for MCP */
         if (x != 0.0)
            x *= exp(v->c[0]);
         x = HTS_mlsadf(x, v->c, m, alpha, PADEORDER, v->d1);
      } else {                  /* for LSP */
         if (!NGAIN)
            x *= v->c[0];
         x = HTS_mglsadf(x, v->c, m, alpha, v->stage, v->d1);
      }
      x *= volume;

      /* output */
      if (rawdata)
         rawdata[rawidx++] = x;
      if (audio) {
         if (x > 32767.0)
            xs = 32767;
         else if (x < -32768.0)
            xs = -32768;
         else
            xs = (short) x;
         HTS_Audio_write(audio, xs);
      }

      for (i = 0; i <= m; i++)
         v->c[i] += v->cinc[i];
   }

   HTS_Vocoder_end_excitation(v, p);
   HTS_movem(v->cc, v->c, m + 1);
}